

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O3

void duckdb::TemplatedLoopCombineHash<false,duckdb::string_t>
               (Vector *input,Vector *hashes,SelectionVector *rsel,idx_t count)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  hash_t hVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar9;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  idx_t ridx_1;
  idx_t ridx;
  ulong uVar10;
  idx_t ridx_2;
  string_t val;
  string_t val_00;
  string_t val_01;
  string_t val_02;
  string_t val_03;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (hashes->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (ulong *)hashes->data;
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      val_00.value.pointer.ptr = (char *)rsel;
      val_00.value._0_8_ = *(undefined8 *)(input->data + 8);
      uVar5 = Hash<duckdb::string_t>(*(duckdb **)input->data,val_00);
    }
    else {
      uVar5 = 0xbf58476d1ce4e5b9;
    }
    uVar9 = *puVar1;
    *puVar1 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d ^ uVar5;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (hashes->vector_type == CONSTANT_VECTOR) {
      uVar5 = *(ulong *)hashes->data;
      Vector::SetVectorType(hashes,FLAT_VECTOR);
      pdVar3 = hashes->data;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar4 = (local_78.sel)->sel_vector;
          uVar10 = 0;
          uVar9 = extraout_RDX_00;
          do {
            uVar7 = uVar10;
            if (psVar4 != (sel_t *)0x0) {
              uVar7 = (ulong)psVar4[uVar10];
            }
            val_03.value.pointer.ptr = (char *)uVar9;
            val_03.value._0_8_ = *(undefined8 *)(local_78.data + uVar7 * 0x10 + 8);
            hVar8 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar7 * 0x10),val_03);
            *(hash_t *)(pdVar3 + uVar10 * 8) = hVar8 ^ (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d
            ;
            uVar10 = uVar10 + 1;
            uVar9 = extraout_RDX_02;
          } while (count != uVar10);
        }
      }
      else if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar10 = 0;
        uVar9 = extraout_RDX_00;
        do {
          uVar7 = uVar10;
          if (psVar4 != (sel_t *)0x0) {
            uVar7 = (ulong)psVar4[uVar10];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
LAB_00e4265c:
            val.value.pointer.ptr = (char *)uVar9;
            val.value._0_8_ = *(undefined8 *)(local_78.data + uVar7 * 0x10 + 8);
            uVar6 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar7 * 0x10),val);
            uVar9 = extraout_RDX_01;
          }
          else {
            uVar9 = uVar7 >> 6;
            uVar6 = 0xbf58476d1ce4e5b9;
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9]
                 >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00e4265c;
          }
          *(ulong *)(pdVar3 + uVar10 * 8) = uVar6 ^ (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          uVar10 = uVar10 + 1;
        } while (count != uVar10);
      }
    }
    else {
      pdVar3 = hashes->data;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar4 = (local_78.sel)->sel_vector;
          uVar9 = 0;
          uVar5 = extraout_RDX;
          do {
            uVar10 = uVar9;
            if (psVar4 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar4[uVar9];
            }
            val_02.value.pointer.ptr = (char *)uVar5;
            val_02.value._0_8_ = *(undefined8 *)(local_78.data + uVar10 * 0x10 + 8);
            hVar8 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar10 * 0x10),val_02);
            uVar5 = (*(ulong *)(pdVar3 + uVar9 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + uVar9 * 8)) *
                    -0x2917014799a6026d ^ hVar8;
            *(ulong *)(pdVar3 + uVar9 * 8) = uVar5;
            uVar9 = uVar9 + 1;
          } while (count != uVar9);
        }
      }
      else if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar9 = 0;
        uVar5 = extraout_RDX;
        do {
          uVar10 = uVar9;
          if (psVar4 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar4[uVar9];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
LAB_00e42714:
            val_01.value.pointer.ptr = (char *)uVar5;
            val_01.value._0_8_ = *(undefined8 *)(local_78.data + uVar10 * 0x10 + 8);
            uVar7 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar10 * 0x10),val_01);
          }
          else {
            uVar5 = uVar10 >> 6;
            uVar7 = 0xbf58476d1ce4e5b9;
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5]
                 >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00e42714;
          }
          uVar5 = (*(ulong *)(pdVar3 + uVar9 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + uVar9 * 8)) *
                  -0x2917014799a6026d ^ uVar7;
          *(ulong *)(pdVar3 + uVar9 * 8) = uVar5;
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void TemplatedLoopCombineHash(Vector &input, Vector &hashes, const SelectionVector *rsel, idx_t count) {
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR && hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto ldata = ConstantVector::GetData<T>(input);
		auto hash_data = ConstantVector::GetData<hash_t>(hashes);

		auto other_hash = HashOp::Operation(*ldata, ConstantVector::IsNull(input));
		*hash_data = CombineHashScalar(*hash_data, other_hash);
	} else {
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);
		if (hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// mix constant with non-constant, first get the constant value
			auto constant_hash = *ConstantVector::GetData<hash_t>(hashes);
			// now re-initialize the hashes vector to an empty flat vector
			hashes.SetVectorType(VectorType::FLAT_VECTOR);
			TightLoopCombineHashConstant<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata), constant_hash,
			                                          FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                          idata.validity);
		} else {
			D_ASSERT(hashes.GetVectorType() == VectorType::FLAT_VECTOR);
			TightLoopCombineHash<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata),
			                                  FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                  idata.validity);
		}
	}
}